

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

int FFSdecode_to_buffer(FFSContext iocontext,char *src,void *dest)

{
  FFSTypeHandle_conflict ioformat_00;
  char *in_RDI;
  FFSTypeHandle_conflict ioformat;
  int in_stack_00000144;
  void *in_stack_00000148;
  char *in_stack_00000150;
  FFSTypeHandle_conflict in_stack_00000158;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  ioformat_00 = FFSTypeHandle_from_encode
                          ((FFSContext)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,in_RDI);
  if (ioformat_00 == (FFSTypeHandle_conflict)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = check_conversion(ioformat_00);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = FFSinternal_decode(in_stack_00000158,in_stack_00000150,in_stack_00000148,
                                 in_stack_00000144);
    }
  }
  return iVar1;
}

Assistant:

extern int
FFSdecode_to_buffer(FFSContext iocontext, char *src, void *dest)
{
    FFSTypeHandle ioformat;
    ioformat = FFSTypeHandle_from_encode(iocontext, src);
    if (ioformat == NULL) {
	return 0;
    }
    if (!check_conversion(ioformat)) {
	return 0;
    }
    return FFSinternal_decode(ioformat, src, dest, 1);
}